

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

bool __thiscall
crnlib::symbol_codec::decode_receive_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,
          static_huffman_data_model *pDeltaModel)

{
  vector<unsigned_char> *this_00;
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  uint i;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint num_remaining;
  uint uVar8;
  ulong uVar9;
  ulong __n;
  uint uVar10;
  static_huffman_data_model dm;
  
  uVar4 = math::total_bits(0x2000);
  uVar4 = decode_bits(this,uVar4);
  if (uVar4 == 0) {
    static_huffman_data_model::clear(model);
    bVar3 = true;
  }
  else {
    __n = (ulong)uVar4;
    this_00 = &model->m_code_sizes;
    bVar3 = false;
    vector<unsigned_char>::resize(this_00,uVar4,false);
    memset((model->m_code_sizes).m_p,0,__n);
    uVar5 = get_bits(this,5);
    if (0xffffffea < uVar5 - 0x16) {
      dm.m_total_syms = 0;
      dm.m_codes.m_p = (unsigned_short *)0x0;
      dm.m_codes.m_size = 0;
      dm.m_codes.m_capacity = 0;
      dm.m_code_sizes.m_p = (uchar *)0x0;
      dm.m_code_sizes.m_size._0_1_ = 0;
      dm.m_code_sizes._9_7_ = 0;
      dm.m_pDecode_tables._0_1_ = 0;
      dm._41_8_ = 0;
      vector<unsigned_char>::resize(&dm.m_code_sizes,0x15,false);
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        uVar6 = get_bits(this,3);
        dm.m_code_sizes.m_p[(byte)(&g_most_probable_codelength_codes)[uVar9]] = (uchar)uVar6;
      }
      bVar2 = static_huffman_data_model::prepare_decoder_tables(&dm);
      uVar10 = 0;
      bVar3 = false;
      if (bVar2) {
        do {
          while( true ) {
            while( true ) {
              uVar8 = uVar4 - uVar10;
              if (uVar4 <= uVar10) {
                if (uVar4 == uVar10) {
                  if ((pDeltaModel != (static_huffman_data_model *)0x0) &&
                     (pDeltaModel->m_total_syms != 0)) {
                    uVar10 = (pDeltaModel->m_code_sizes).m_size;
                    if (uVar10 < uVar4) {
                      __n = (ulong)uVar10;
                    }
                    for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
                      uVar8 = (uint)(pDeltaModel->m_code_sizes).m_p[uVar9] +
                              (uint)this_00->m_p[uVar9];
                      uVar10 = uVar8 - 0x11 & 0xff;
                      if (uVar8 < 0x11) {
                        uVar10 = uVar8;
                      }
                      this_00->m_p[uVar9] = (uchar)uVar10;
                    }
                  }
                  bVar3 = static_huffman_data_model::prepare_decoder_tables(model);
                  goto LAB_0017b1c3;
                }
                goto LAB_0017b1b1;
              }
              uVar5 = decode(this,&dm);
              uVar9 = (ulong)uVar10;
              if (0x10 < uVar5) break;
              uVar10 = uVar10 + 1;
              this_00->m_p[uVar9] = (uchar)uVar5;
            }
            if (uVar5 == 0x12) break;
            if (uVar5 == 0x11) {
              uVar5 = get_bits(this,3);
              uVar7 = uVar5 + 3;
              uVar10 = uVar10 + uVar5 + 3;
              goto LAB_0017b0e0;
            }
            if (1 < uVar5 - 0x13) goto LAB_0017b1b1;
            if (uVar5 == 0x13) {
              uVar5 = get_bits(this,2);
              uVar7 = uVar5 + 3;
            }
            else {
              uVar5 = get_bits(this,6);
              uVar7 = uVar5 + 7;
            }
            bVar3 = false;
            if ((uVar10 == 0) || (uVar8 < uVar7)) goto LAB_0017b1c3;
            uVar1 = this_00->m_p[uVar10 - 1];
            if (uVar1 == '\0') goto LAB_0017b1b1;
            for (; uVar9 < uVar7 + uVar10; uVar9 = uVar9 + 1) {
              this_00->m_p[uVar9] = uVar1;
            }
            uVar10 = (uint)uVar9;
          }
          uVar5 = get_bits(this,7);
          uVar7 = uVar5 + 0xb;
          uVar10 = uVar10 + uVar5 + 0xb;
LAB_0017b0e0:
        } while (uVar7 <= uVar8);
LAB_0017b1b1:
        bVar3 = false;
      }
LAB_0017b1c3:
      static_huffman_data_model::~static_huffman_data_model(&dm);
    }
  }
  return bVar3;
}

Assistant:

bool symbol_codec::decode_receive_static_huffman_data_model(static_huffman_data_model& model, static_huffman_data_model* pDeltaModel)
    {
        CRNLIB_ASSERT(m_mode == cDecoding);

        const uint total_used_syms = decode_bits(math::total_bits(prefix_coding::cMaxSupportedSyms));
        if (!total_used_syms)
        {
            model.clear();
            return true;
        }

        model.m_code_sizes.resize(total_used_syms);
        memset(&model.m_code_sizes[0], 0, sizeof(model.m_code_sizes[0]) * total_used_syms);

        const uint num_codelength_codes_to_send = decode_bits(5);
        if ((num_codelength_codes_to_send < 1) || (num_codelength_codes_to_send > cMaxCodelengthCodes))
        {
            return false;
        }

        static_huffman_data_model dm;
        dm.m_code_sizes.resize(cMaxCodelengthCodes);

        for (uint i = 0; i < num_codelength_codes_to_send; i++)
        {
            dm.m_code_sizes[g_most_probable_codelength_codes[i]] = static_cast<uint8>(decode_bits(3));
        }

        if (!dm.prepare_decoder_tables())
        {
            return false;
        }

        uint ofs = 0;
        while (ofs < total_used_syms)
        {
            const uint num_remaining = total_used_syms - ofs;

            uint code = decode(dm);
            if (code <= 16)
            {
                model.m_code_sizes[ofs++] = static_cast<uint8>(code);
            }
            else if (code == cSmallZeroRunCode)
            {
                uint len = decode_bits(cSmallZeroRunExtraBits) + cMinSmallZeroRunSize;
                if (len > num_remaining)
                {
                    return false;
                }
                ofs += len;
            }
            else if (code == cLargeZeroRunCode)
            {
                uint len = decode_bits(cLargeZeroRunExtraBits) + cMinLargeZeroRunSize;
                if (len > num_remaining)
                {
                    return false;
                }
                ofs += len;
            }
            else if ((code == cSmallRepeatCode) || (code == cLargeRepeatCode))
            {
                uint len;
                if (code == cSmallRepeatCode)
                {
                    len = decode_bits(cSmallNonZeroRunExtraBits) + cSmallMinNonZeroRunSize;
                }
                else
                {
                    len = decode_bits(cLargeNonZeroRunExtraBits) + cLargeMinNonZeroRunSize;
                }

                if ((!ofs) || (len > num_remaining))
                {
                    return false;
                }
                const uint prev = model.m_code_sizes[ofs - 1];
                if (!prev)
                {
                    return false;
                }
                const uint end = ofs + len;
                while (ofs < end)
                {
                    model.m_code_sizes[ofs++] = static_cast<uint8>(prev);
                }
            }
            else
            {
                CRNLIB_ASSERT(0);
                return false;
            }
        }

        if (ofs != total_used_syms)
        {
            return false;
        }

        if ((pDeltaModel) && (pDeltaModel->get_total_syms()))
        {
            uint n = math::minimum(pDeltaModel->m_code_sizes.size(), total_used_syms);
            for (uint i = 0; i < n; i++)
            {
                int codesize = model.m_code_sizes[i] + pDeltaModel->m_code_sizes[i];
                if (codesize > 16)
                {
                    codesize -= 17;
                }
                model.m_code_sizes[i] = static_cast<uint8>(codesize);
            }
        }

        return model.prepare_decoder_tables();
    }